

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::flush_variable_declaration(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_b0;
  string local_90 [32];
  string local_70;
  undefined1 local_40 [8];
  string initializer;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  initializer.field_2._8_8_ =
       Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (((SPIRVariable *)initializer.field_2._8_8_ != (SPIRVariable *)0x0) &&
     ((((SPIRVariable *)initializer.field_2._8_8_)->deferred_declaration & 1U) != 0)) {
    ::std::__cxx11::string::string((string *)local_40);
    if (((((this->options).force_zero_initialized_variables & 1U) != 0) &&
        (((*(int *)(initializer.field_2._8_8_ + 0x10) == 7 ||
          (*(int *)(initializer.field_2._8_8_ + 0x10) == 8)) ||
         (*(int *)(initializer.field_2._8_8_ + 0x10) == 6)))) &&
       (uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(initializer.field_2._8_8_ + 0x18)), uVar2 == 0)) {
      type = Compiler::get_variable_data_type
                       (&this->super_Compiler,(SPIRVariable *)initializer.field_2._8_8_);
      bVar1 = type_can_zero_initialize(this,type);
      if (bVar1) {
        uVar2 = Compiler::get_variable_data_type_id
                          (&this->super_Compiler,(SPIRVariable *)initializer.field_2._8_8_);
        (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_90,this,(ulong)uVar2);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_70,(spirv_cross *)0x5abcd8,(char (*) [4])local_90,in_RCX);
        ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string(local_90);
      }
    }
    variable_decl_function_local_abi_cxx11_
              (&local_b0,this,(SPIRVariable *)initializer.field_2._8_8_);
    statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (this,&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5abb6c);
    ::std::__cxx11::string::~string((string *)&local_b0);
    *(undefined1 *)(initializer.field_2._8_8_ + 0x98) = 0;
    ::std::__cxx11::string::~string((string *)local_40);
  }
  if (initializer.field_2._8_8_ != 0) {
    emit_variable_temporary_copies(this,(SPIRVariable *)initializer.field_2._8_8_);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_variable_declaration(uint32_t id)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->deferred_declaration)
	{
		string initializer;
		if (options.force_zero_initialized_variables &&
		    (var->storage == StorageClassFunction || var->storage == StorageClassGeneric ||
		     var->storage == StorageClassPrivate) &&
		    !var->initializer && type_can_zero_initialize(get_variable_data_type(*var)))
		{
			initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(*var)));
		}

		statement(variable_decl_function_local(*var), initializer, ";");
		var->deferred_declaration = false;
	}
	if (var)
	{
		emit_variable_temporary_copies(*var);
	}
}